

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posixcrashhandler.cpp
# Opt level: O0

char * __thiscall
Debug::PosixCrashHandler::dlDemangle
          (PosixCrashHandler *this,void *addr,char *symbol,int frameIndex,char *stackMemory)

{
  int iVar1;
  char *local_b0;
  char *local_a8;
  char *demangled;
  size_t length;
  PosixCrashHandler *pPStack_68;
  int status;
  char *stackFrame;
  undefined1 local_58 [4];
  int stackFrameSize;
  Dl_info info;
  char *stackMemory_local;
  int frameIndex_local;
  char *symbol_local;
  void *addr_local;
  PosixCrashHandler *this_local;
  
  info.dli_saddr = stackMemory;
  iVar1 = dladdr(addr,local_58);
  if (iVar1 == 0) {
    this_local = (PosixCrashHandler *)0x0;
  }
  else {
    stackFrame._4_4_ = 0x1000;
    pPStack_68 = (PosixCrashHandler *)fake_alloc((char **)&info.dli_saddr,0x1000);
    if ((info.dli_fbase == (void *)0x0) || (*info.dli_fbase != '_')) {
      snprintf((char *)pPStack_68,0x1000,"%-3d %*p %s\n",(ulong)(uint)frameIndex,0x12,addr,symbol);
    }
    else {
      length._4_4_ = -1;
      demangled = (char *)0x2800;
      local_a8 = (char *)__cxa_demangle(info.dli_fbase,this->m_demangleMemory,&demangled,
                                        (long)&length + 4);
      if (length._4_4_ == 0) {
        this->m_demangleMemory = local_a8;
      }
      else {
        local_b0 = symbol;
        if (info.dli_fbase != (void *)0x0) {
          local_b0 = (char *)info.dli_fbase;
        }
        local_a8 = local_b0;
      }
      snprintf((char *)pPStack_68,0x1000,"%-3d %*p %s + %zd\n",(ulong)(uint)frameIndex,0x12,addr,
               local_a8,(long)addr - (long)info.dli_sname);
    }
    this_local = pPStack_68;
  }
  return (char *)this_local;
}

Assistant:

char *PosixCrashHandler::dlDemangle(void *addr, char *symbol, int frameIndex, char *stackMemory) {
        Dl_info info;
        if (dladdr(addr, &info) != 0) {
            const int stackFrameSize = 4096;
            char *stackFrame = fake_alloc(&stackMemory, stackFrameSize);

            if ((info.dli_sname != NULL) && (info.dli_sname[0] == '_')) {
                int status = -1;
                size_t length = DEMANGLE_MEMORY_SIZE;
                char *demangled = abi::__cxa_demangle(info.dli_sname, m_demangleMemory, &length, &status);
                if (status == 0) { m_demangleMemory = demangled; }

                snprintf(stackFrame, stackFrameSize, "%-3d %*p %s + %zd\n",
                         frameIndex, int(2 + sizeof(void*) * 2), addr,
                         status == 0 ? demangled :
                                       info.dli_sname == 0 ? symbol : info.dli_sname,
                         (char *)addr - (char *)info.dli_saddr);

            } else {
                snprintf(stackFrame, stackFrameSize, "%-3d %*p %s\n",
                         frameIndex, int(2 + sizeof(void*) * 2), addr, symbol);
            }

            return stackFrame;
        }

        return NULL;
    }